

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CodeGeneratorResponse_File::MergeFrom
          (CodeGeneratorResponse_File *this,CodeGeneratorResponse_File *from)

{
  uint uVar1;
  CodeGeneratorResponse_File *pCVar2;
  string *psVar3;
  LogMessage *other;
  uint32_t *puVar4;
  Arena *pAVar5;
  GeneratedCodeInfo *this_00;
  GeneratedCodeInfo *from_00;
  LogFinisher local_95;
  uint32_t cached_has_bits;
  byte local_81;
  LogMessage local_80;
  CodeGeneratorResponse_File *local_48;
  CodeGeneratorResponse_File *from_local;
  CodeGeneratorResponse_File *this_local;
  CodeGeneratorResponse_File *local_30;
  string *local_28;
  CodeGeneratorResponse_File *local_20;
  string *local_18;
  CodeGeneratorResponse_File *local_10;
  
  local_81 = 0;
  local_48 = from;
  from_local = this;
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_80,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/plugin.pb.cc"
               ,0x4be);
    local_81 = 1;
    other = internal::LogMessage::operator<<(&local_80,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_95,other);
  }
  if ((local_81 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_80);
  }
  puVar4 = internal::HasBits<1UL>::operator[](&local_48->_has_bits_,0);
  uVar1 = *puVar4;
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      this_local = (CodeGeneratorResponse_File *)_internal_name_abi_cxx11_(local_48);
      local_30 = this;
      puVar4 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
      pCVar2 = this_local;
      *puVar4 = *puVar4 | 1;
      pAVar5 = MessageLite::GetArenaForAllocation((MessageLite *)this);
      internal::ArenaStringPtr::Set(&this->name_,pCVar2,pAVar5);
    }
    if ((uVar1 & 2) != 0) {
      local_28 = _internal_insertion_point_abi_cxx11_(local_48);
      local_20 = this;
      puVar4 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
      psVar3 = local_28;
      *puVar4 = *puVar4 | 2;
      pAVar5 = MessageLite::GetArenaForAllocation((MessageLite *)this);
      internal::ArenaStringPtr::Set(&this->insertion_point_,psVar3,pAVar5);
    }
    if ((uVar1 & 4) != 0) {
      local_18 = _internal_content_abi_cxx11_(local_48);
      local_10 = this;
      puVar4 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
      psVar3 = local_18;
      *puVar4 = *puVar4 | 4;
      pAVar5 = MessageLite::GetArenaForAllocation((MessageLite *)this);
      internal::ArenaStringPtr::Set(&this->content_,psVar3,pAVar5);
    }
    if ((uVar1 & 8) != 0) {
      this_00 = _internal_mutable_generated_code_info(this);
      from_00 = _internal_generated_code_info(local_48);
      GeneratedCodeInfo::MergeFrom(this_00,from_00);
    }
  }
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(this->super_Message).super_MessageLite._internal_metadata_,
             &(local_48->super_Message).super_MessageLite._internal_metadata_);
  return;
}

Assistant:

void CodeGeneratorResponse_File::MergeFrom(const CodeGeneratorResponse_File& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.compiler.CodeGeneratorResponse.File)
  GOOGLE_DCHECK_NE(&from, this);
  uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = from._has_bits_[0];
  if (cached_has_bits & 0x0000000fu) {
    if (cached_has_bits & 0x00000001u) {
      _internal_set_name(from._internal_name());
    }
    if (cached_has_bits & 0x00000002u) {
      _internal_set_insertion_point(from._internal_insertion_point());
    }
    if (cached_has_bits & 0x00000004u) {
      _internal_set_content(from._internal_content());
    }
    if (cached_has_bits & 0x00000008u) {
      _internal_mutable_generated_code_info()->::PROTOBUF_NAMESPACE_ID::GeneratedCodeInfo::MergeFrom(from._internal_generated_code_info());
    }
  }
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
}